

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

PropertyQueryFlags __thiscall
Js::CrossSiteObject<Js::JavascriptNumberObject>::GetItemReferenceQuery
          (CrossSiteObject<Js::JavascriptNumberObject> *this,Var originalInstance,uint32 index,
          Var *value,ScriptContext *requestContext)

{
  PropertyQueryFlags val;
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var pvVar2;
  PropertyQueryFlags result;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint32 index_local;
  Var originalInstance_local;
  CrossSiteObject<Js::JavascriptNumberObject> *this_local;
  
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pvVar2 = CrossSite::MarshalVar(scriptContext,originalInstance,false);
  val = DynamicObject::GetItemReferenceQuery
                  ((DynamicObject *)this,pvVar2,index,value,requestContext);
  BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  if (BVar1 != 0) {
    pvVar2 = CrossSite::MarshalVar(requestContext,*value,false);
    *value = pvVar2;
  }
  return val;
}

Assistant:

PropertyQueryFlags CrossSiteObject<T>::GetItemReferenceQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        originalInstance = CrossSite::MarshalVar(this->GetScriptContext(), originalInstance);
        PropertyQueryFlags result = __super::GetItemReferenceQuery(originalInstance, index, value, requestContext);
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(result))
        {
            *value = CrossSite::MarshalVar(requestContext, *value);
        }
        return result;
    }